

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O0

unique_ptr<TestState,_std::default_delete<TestState>_> __thiscall
TestState::Deserialize(TestState *this,CBS *cbs,SSL_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer pTVar4;
  uint8_t *puVar5;
  allocator local_a9;
  string local_a8 [32];
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_88;
  undefined4 local_80;
  ulong local_70;
  uint64_t usec;
  uint64_t sec;
  uint16_t kVersion;
  uint16_t version;
  __single_object state;
  CBS text;
  CBS pending_session;
  CBS in;
  SSL_CTX *ctx_local;
  CBS *cbs_local;
  
  std::make_unique<TestState>();
  sec._4_2_ = 0;
  iVar2 = CBS_get_u24_length_prefixed(cbs,(CBS *)&pending_session.len);
  if (((((iVar2 == 0) ||
        (iVar2 = CBS_get_u16((CBS *)&pending_session.len,(uint16_t *)((long)&sec + 6)), iVar2 == 0))
       || (sec._6_2_ != 0)) ||
      ((iVar2 = CBS_get_u24_length_prefixed((CBS *)&pending_session.len,(CBS *)&text.len),
       iVar2 == 0 ||
       (iVar2 = CBS_get_u16_length_prefixed((CBS *)&pending_session.len,(CBS *)&state), iVar2 == 0))
      )) || ((iVar2 = CBS_get_asn1_uint64((CBS *)&pending_session.len,&usec), iVar2 == 0 ||
             ((iVar2 = CBS_get_asn1_uint64((CBS *)&pending_session.len,&local_70), iVar2 == 0 ||
              (999999 < local_70)))))) {
    std::unique_ptr<TestState,std::default_delete<TestState>>::
    unique_ptr<std::default_delete<TestState>,void>
              ((unique_ptr<TestState,std::default_delete<TestState>> *)this,(nullptr_t)0x0);
  }
  else {
    sVar3 = CBS_len((CBS *)&text.len);
    if (sVar3 != 0) {
      bssl::SSL_SESSION_parse((bssl *)&local_88,(CBS *)&text.len,ctx->x509_method,ctx->pool);
      pTVar4 = std::unique_ptr<TestState,_std::default_delete<TestState>_>::operator->
                         ((unique_ptr<TestState,_std::default_delete<TestState>_> *)
                          &stack0xffffffffffffffa8);
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                (&pTVar4->pending_session,&local_88);
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_88);
      pTVar4 = std::unique_ptr<TestState,_std::default_delete<TestState>_>::operator->
                         ((unique_ptr<TestState,_std::default_delete<TestState>_> *)
                          &stack0xffffffffffffffa8);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pTVar4->pending_session);
      if (!bVar1) {
        std::unique_ptr<TestState,std::default_delete<TestState>>::
        unique_ptr<std::default_delete<TestState>,void>
                  ((unique_ptr<TestState,std::default_delete<TestState>> *)this,(nullptr_t)0x0);
        goto LAB_00156bc0;
      }
    }
    puVar5 = CBS_data((CBS *)&state);
    sVar3 = CBS_len((CBS *)&state);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,(char *)puVar5,sVar3,&local_a9);
    pTVar4 = std::unique_ptr<TestState,_std::default_delete<TestState>_>::operator->
                       ((unique_ptr<TestState,_std::default_delete<TestState>_> *)
                        &stack0xffffffffffffffa8);
    std::__cxx11::string::operator=((string *)&pTVar4->msg_callback_text,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    g_clock.tv_sec = usec;
    g_clock.tv_usec = local_70;
    std::unique_ptr<TestState,_std::default_delete<TestState>_>::unique_ptr
              ((unique_ptr<TestState,_std::default_delete<TestState>_> *)this,
               (unique_ptr<TestState,_std::default_delete<TestState>_> *)&stack0xffffffffffffffa8);
  }
LAB_00156bc0:
  local_80 = 1;
  std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
            ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&stack0xffffffffffffffa8);
  return (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)
         (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)this;
}

Assistant:

std::unique_ptr<TestState> TestState::Deserialize(CBS *cbs, SSL_CTX *ctx) {
  CBS in, pending_session, text;
  auto state = std::make_unique<TestState>();
  uint16_t version;
  constexpr uint16_t kVersion = 0;
  uint64_t sec, usec;
  if (!CBS_get_u24_length_prefixed(cbs, &in) ||  //
      !CBS_get_u16(&in, &version) ||             //
      version > kVersion ||
      !CBS_get_u24_length_prefixed(&in, &pending_session) ||
      !CBS_get_u16_length_prefixed(&in, &text) ||
      !CBS_get_asn1_uint64(&in, &sec) ||   //
      !CBS_get_asn1_uint64(&in, &usec) ||  //
      usec >= 1000000) {
    return nullptr;
  }
  if (CBS_len(&pending_session)) {
    state->pending_session = SSL_SESSION_parse(
        &pending_session, ctx->x509_method, ctx->pool);
    if (!state->pending_session) {
      return nullptr;
    }
  }
  state->msg_callback_text = std::string(
      reinterpret_cast<const char *>(CBS_data(&text)), CBS_len(&text));
  g_clock.tv_sec = sec;
  g_clock.tv_usec = usec;
  return state;
}